

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::from_chars(c4 *this,csubstr buf,raw_wrapper *r)

{
  code *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined8 *puVar4;
  char *pcVar5;
  c4 *__src;
  
  puVar4 = (undefined8 *)buf.len;
  pcVar5 = buf.str;
  if ((((char *)puVar4[1] <= pcVar5) &&
      (__src = (c4 *)(-puVar4[2] & (ulong)(this + puVar4[2] + -1)), __src != (c4 *)0x0)) &&
     ((ulong)((long)__src - (long)this) <= (ulong)((long)pcVar5 - puVar4[1]))) {
    if ((__src < this) || (this + (long)pcVar5 < __src)) {
      from_chars();
    }
    memcpy((void *)*puVar4,__src,puVar4[1]);
    return true;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return (bool)uVar3;
    }
  }
  handle_error(0x1f9037,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x4307,"ptr != nullptr");
}

Assistant:

bool from_chars(csubstr buf, fmt::raw_wrapper *r)
{
    void * vptr = (void*)buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r->alignment, r->len, vptr, space);
    C4_CHECK(ptr != nullptr);
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    //size_t dim = (ptr - buf.str) + r->len;
    memcpy(r->buf, ptr, r->len);
    return true;
}